

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

ChunkDrawable * __thiscall
FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
          (FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *this,unsigned_long *key
          )

{
  bool bVar1;
  pointer ppVar2;
  __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  *in_RSI;
  piecewise_construct_t *in_RDI;
  __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  pos;
  less<unsigned_long> *in_stack_ffffffffffffff88;
  __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffa7;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  local_48;
  pair<unsigned_long,_ChunkDrawable> *local_40;
  piecewise_construct_t local_31;
  pair<unsigned_long,_ChunkDrawable> *local_30;
  pair<unsigned_long,_ChunkDrawable> *local_28;
  __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  local_20;
  __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  *local_18;
  ChunkDrawable *local_8;
  
  local_18 = in_RSI;
  local_28 = (pair<unsigned_long,_ChunkDrawable> *)
             std::
             vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
             ::begin((vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                      *)in_stack_ffffffffffffff88);
  local_30 = (pair<unsigned_long,_ChunkDrawable> *)
             std::
             vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
             ::end((vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                    *)in_stack_ffffffffffffff88);
  local_31 = in_RDI[0x19];
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,ChunkDrawable>*,std::vector<std::pair<unsigned_long,ChunkDrawable>,std::allocator<std::pair<unsigned_long,ChunkDrawable>>>>,unsigned_long,FlatMap<unsigned_long,ChunkDrawable,std::less<unsigned_long>>::ValueToKeyComparator>
                       (local_28,local_30,local_18);
  local_40 = (pair<unsigned_long,_ChunkDrawable> *)
             std::
             vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
             ::end((vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                    *)in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                      *)in_stack_ffffffffffffff88);
  uVar3 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff88 = (less<unsigned_long> *)(in_RDI + 0x18);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
             ::operator->(&local_20);
    uVar3 = std::less<unsigned_long>::operator()
                      (in_stack_ffffffffffffff88,(unsigned_long *)local_18,&ppVar2->first);
    in_stack_ffffffffffffff90 = local_18;
  }
  if ((bool)uVar3 == false) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
             ::operator->(&local_20);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,ChunkDrawable>const*,std::vector<std::pair<unsigned_long,ChunkDrawable>,std::allocator<std::pair<unsigned_long,ChunkDrawable>>>>
    ::__normal_iterator<std::pair<unsigned_long,ChunkDrawable>*>
              (in_stack_ffffffffffffff90,
               (__normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                *)in_stack_ffffffffffffff88);
    std::forward_as_tuple<unsigned_long_const&>((unsigned_long *)in_stack_ffffffffffffff88);
    local_48._M_current =
         (pair<unsigned_long,_ChunkDrawable> *)
         std::
         vector<std::pair<unsigned_long,ChunkDrawable>,std::allocator<std::pair<unsigned_long,ChunkDrawable>>>
         ::emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                   ((vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(uVar3,in_stack_ffffffffffffffa0))
                    ,in_stack_ffffffffffffffa8,in_RDI,
                    (tuple<const_unsigned_long_&> *)in_stack_ffffffffffffff90,
                    (tuple<> *)in_stack_ffffffffffffff88);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
             ::operator->(&local_48);
  }
  local_8 = &ppVar2->second;
  return local_8;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }